

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O3

int __thiscall Sound_Queue::init(Sound_Queue *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  int iVar2;
  sample_t *psVar3;
  SDL_sem *pSVar4;
  char *pcVar5;
  SDL_AudioSpec as;
  undefined4 local_38;
  undefined2 local_34;
  undefined1 local_31;
  undefined2 local_30;
  undefined4 local_2c;
  code *local_28;
  Sound_Queue *local_20;
  
  if (this->bufs != (sample_t *)0x0) {
    __assert_fail("!bufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/Sound_Queue.cpp"
                  ,0x41,"const char *Sound_Queue::init(long, int)");
  }
  psVar3 = (sample_t *)operator_new__(0x3000);
  this->bufs = psVar3;
  if (this->bufs == (sample_t *)0x0) {
    return 0x117564;
  }
  pSVar4 = (SDL_sem *)SDL_CreateSemaphore(2);
  this->free_sem = pSVar4;
  if (this->free_sem == (SDL_sem *)0x0) {
    pcVar5 = (char *)SDL_GetError();
    if (pcVar5 == (char *)0x0) {
      return 0x117572;
    }
    cVar1 = *pcVar5;
    iVar2 = 0x117572;
  }
  else {
    local_38 = SUB84(ctx,0);
    local_34 = 0x8010;
    local_31 = 0;
    local_30 = 0x800;
    local_2c = 0;
    local_28 = fill_buffer_;
    local_20 = this;
    iVar2 = SDL_OpenAudio(&local_38,0);
    if (-1 < iVar2) {
      SDL_PauseAudio(0);
      this->sound_open = true;
      return 0;
    }
    pcVar5 = (char *)SDL_GetError();
    if (pcVar5 == (char *)0x0) {
      return 0x11758c;
    }
    cVar1 = *pcVar5;
    iVar2 = 0x11758c;
  }
  if (cVar1 != '\0') {
    iVar2 = (int)pcVar5;
  }
  return iVar2;
}

Assistant:

const char* Sound_Queue::init( long sample_rate, int chan_count )
{
	assert( !bufs ); // can only be initialized once
	
	bufs = new sample_t [(long) buf_size * buf_count];
	if ( !bufs )
		return "Out of memory";
	
	free_sem = SDL_CreateSemaphore( buf_count - 1 );
	if ( !free_sem )
		return sdl_error( "Couldn't create semaphore" );
	
	SDL_AudioSpec as;
	as.freq = sample_rate;
	as.format = AUDIO_S16SYS;
	as.channels = chan_count;
	as.silence = 0;
	as.samples = buf_size;
	as.size = 0;
	as.callback = fill_buffer_;
	as.userdata = this;
	if ( SDL_OpenAudio( &as, NULL ) < 0 )
		return sdl_error( "Couldn't open SDL audio" );
	SDL_PauseAudio( false );
	sound_open = true;
	
	return NULL;
}